

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O2

int libtorrent::unchoke_sort
              (vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               *peers,int max_upload_rate,time_duration unchoke_interval,session_settings *sett)

{
  pointer pppVar1;
  peer_connection *ppVar2;
  int iVar3;
  uint uVar4;
  pointer pppVar5;
  code *pcVar6;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>
  *__comp;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>
  *__comp_00;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var7;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *__range2;
  uint uVar8;
  peer_connection **pppVar9;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var10;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var11;
  peer_connection **pppVar12;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>
  local_90;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>
  local_80;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>
  local_70;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>
  local_60;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>
  local_50;
  _Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>
  local_40;
  
  iVar3 = aux::session_settings::get_int(sett,0x401f);
  if (iVar3 == 3) {
    pppVar1 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar5 = (peers->
                   super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; pppVar5 != pppVar1;
        pppVar5 = pppVar5 + 1) {
      ppVar2 = *pppVar5;
      iVar3 = (*(ppVar2->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(ppVar2);
      if (((char)iVar3 == '\0') &&
         (((ppVar2->super_peer_connection_hot_members).field_0x28 & 0x10) != 0)) {
        if ((ppVar2->field_0x762 & 0x40) == 0) {
          peer_connection::decrease_est_reciprocation_rate(ppVar2);
        }
        else {
          peer_connection::increase_est_reciprocation_rate(ppVar2);
        }
      }
    }
    local_40._M_f = anon_unknown_10::bittyrant_unchoke_compare;
    std::
    sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
              ((__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                )(peers->
                 super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                )(peers->
                 super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,&local_40);
    pppVar5 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    iVar3 = 0;
    while( true ) {
      if (pppVar5 ==
          (peers->
          super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return iVar3;
      }
      ppVar2 = *pppVar5;
      if (max_upload_rate < ppVar2->m_est_reciprocation_rate) break;
      iVar3 = iVar3 + 1;
      pppVar5 = pppVar5 + 1;
      max_upload_rate = max_upload_rate - ppVar2->m_est_reciprocation_rate;
    }
    return iVar3;
  }
  uVar4 = aux::session_settings::get_int(sett,0x4053);
  iVar3 = aux::session_settings::get_int(sett,0x401f);
  _Var10._M_current =
       (peers->
       super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 == 2) {
    local_50._M_f = anon_unknown_10::upload_rate_compare;
    std::
    sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
              ((__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                )(peers->
                 super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,_Var10,&local_50);
    pppVar9 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    _Var10._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 1;
    pppVar12 = pppVar9;
    for (iVar3 = 0x400;
        (pppVar12 != _Var10._M_current &&
        (iVar3 <= (int)(((((*pppVar12)->m_statistics).m_stat[0].m_total_counter -
                         (*pppVar12)->m_uploaded_at_last_round) * 1000) /
                       (unchoke_interval.__r / 1000000)))); iVar3 = iVar3 + 0x400) {
      pppVar12 = pppVar12 + 1;
      uVar8 = uVar8 + 1;
    }
  }
  else {
    uVar8 = 0x7fffffff;
    if (uVar4 < 0x7fffffff) {
      uVar8 = uVar4;
    }
    pppVar9 = (peers->
              super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  uVar4 = (uint)((ulong)((long)_Var10._M_current - (long)pppVar9) >> 3);
  if ((int)uVar8 < (int)uVar4) {
    uVar4 = uVar8;
  }
  iVar3 = aux::session_settings::get_int(sett,0x4020);
  if (iVar3 == 0) {
    iVar3 = aux::session_settings::get_int(sett,0x4039);
    _Var11._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var7._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    _Var10._M_current = _Var11._M_current + (int)uVar4;
    __comp_00 = &local_60;
LAB_0018f0db:
    __comp_00->_M_f = anon_unknown_10::unchoke_compare_rr;
    (__comp_00->_M_bound_args).
    super__Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_int>.
    super__Tuple_impl<1UL,_std::_Placeholder<2>,_int>.super__Tuple_impl<2UL,_int>.
    super__Head_base<2UL,_int,_false>._M_head_impl = iVar3;
    std::
    nth_element<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int)>>
              (_Var11,_Var10,_Var7,__comp_00);
  }
  else {
    iVar3 = aux::session_settings::get_int(sett,0x4020);
    if (iVar3 == 1) {
      _Var11._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var7._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      _Var10._M_current = _Var11._M_current + (int)uVar4;
      pcVar6 = anon_unknown_10::unchoke_compare_fastest_upload;
      __comp = &local_70;
    }
    else {
      iVar3 = aux::session_settings::get_int(sett,0x4020);
      if (iVar3 != 2) {
        iVar3 = aux::session_settings::get_int(sett,0x4039);
        _Var11._M_current =
             (peers->
             super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var7._M_current =
             (peers->
             super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        _Var10._M_current = _Var11._M_current + (int)uVar4;
        __comp_00 = &local_90;
        goto LAB_0018f0db;
      }
      _Var11._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var7._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      _Var10._M_current = _Var11._M_current + (int)uVar4;
      pcVar6 = anon_unknown_10::unchoke_compare_anti_leech;
      __comp = &local_80;
    }
    __comp->_M_f = pcVar6;
    std::
    nth_element<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>
              (_Var11,_Var10,_Var7,__comp);
  }
  return uVar8;
}

Assistant:

int unchoke_sort(std::vector<peer_connection*>& peers
		, int const max_upload_rate
		, time_duration const unchoke_interval
		, aux::session_settings const& sett)
	{
#if TORRENT_USE_ASSERTS
		for (auto p : peers)
		{
			TORRENT_ASSERT(p->self());
			TORRENT_ASSERT(p->associated_torrent().lock());
		}
#endif

#if TORRENT_ABI_VERSION == 1
		// ==== BitTyrant ====
		//
		// if we're using the bittyrant unchoker, go through all peers that
		// we have unchoked already, and adjust our estimated reciprocation
		// rate. If the peer has reciprocated, lower the estimate, if it hasn't,
		// increase the estimate (this attempts to optimize "ROI" of upload
		// capacity, by sending just enough to be reciprocated).
		// For more information, see: http://bittyrant.cs.washington.edu/
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::bittyrant_choker)
		{
			for (auto const p : peers)
			{
				if (p->is_choked() || !p->is_interesting()) continue;

				if (!p->has_peer_choked())
				{
					// we're unchoked, we may want to lower our estimated
					// reciprocation rate
					p->decrease_est_reciprocation_rate();
				}
				else
				{
					// we've unchoked this peer, and it hasn't reciprocated
					// we may want to increase our estimated reciprocation rate
					p->increase_est_reciprocation_rate();
				}
			}

			// if we're using the bittyrant choker, sort peers by their return
			// on investment. i.e. download rate / upload rate
			// TODO: use an incremental partial_sort() here
			std::sort(peers.begin(), peers.end()
				, std::bind(&bittyrant_unchoke_compare, _1, _2));

			int upload_capacity_left = max_upload_rate;

			// now, figure out how many peers should be unchoked. We deduct the
			// estimated reciprocation rate from our upload_capacity estimate
			// until there none left
			int upload_slots = 0;

			for (auto const p : peers)
			{
				TORRENT_ASSERT(p != nullptr);

				if (p->est_reciprocation_rate() > upload_capacity_left) break;

				++upload_slots;
				upload_capacity_left -= p->est_reciprocation_rate();
			}

			return upload_slots;
		}
#else
		TORRENT_UNUSED(max_upload_rate);
#endif

		int upload_slots = sett.get_int(settings_pack::unchoke_slots_limit);
		if (upload_slots < 0)
			upload_slots = std::numeric_limits<int>::max();

		// ==== rate-based ====
		//
		// The rate based unchoker looks at our upload rate to peers, and find
		// a balance between number of upload slots and the rate we achieve. The
		// intention is to not spread upload bandwidth too thin, but also to not
		// unchoke few enough peers to not be able to saturate the up-link.
		// this is done by traversing the peers sorted by our upload rate to
		// them in decreasing rates. For each peer we increase our threshold
		// by 1 kB/s. The first peer we get to whom we upload slower than
		// the threshold, we stop and that's the number of unchoke slots we have.
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::rate_based_choker)
		{
			// first reset the number of unchoke slots, because we'll calculate
			// it purely based on the current state of our peers.
			upload_slots = 0;

			// TODO: use an incremental partial_sort() here. We don't need
			// to sort the entire list

			// TODO: make the comparison function a free function and move it
			// into this cpp file
			std::sort(peers.begin(), peers.end()
				, std::bind(&upload_rate_compare, _1, _2));

			// TODO: make configurable
			int rate_threshold = 1024;

			for (auto const p : peers)
			{
				int const rate = int(p->uploaded_in_last_round()
					* 1000 / total_milliseconds(unchoke_interval));

				if (rate < rate_threshold) break;

				++upload_slots;

				// TODO: make configurable
				rate_threshold += 1024;
			}
			++upload_slots;
		}

		// sorts the peers that are eligible for unchoke by download rate and
		// secondary by total upload. The reason for this is, if all torrents are
		// being seeded, the download rate will be 0, and the peers we have sent
		// the least to should be unchoked

		// we use partial sort here, because we only care about the top
		// upload_slots peers.

		int const slots = std::min(upload_slots, int(peers.size()));

		if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::round_robin)
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);

			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::fastest_upload)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_fastest_upload, _1, _2));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::anti_leech)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_anti_leech, _1, _2));
		}
		else
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));

			TORRENT_ASSERT_FAIL();
		}

		return upload_slots;
	}